

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

char * __thiscall kj::Path::basename(Path *this,char *__filename)

{
  bool bVar1;
  size_t sVar2;
  String *pSVar3;
  Array<kj::String> local_a8;
  undefined1 local_90 [8];
  ArrayBuilder<kj::String> newParts;
  Fault local_60;
  Fault f;
  size_t local_50;
  DebugExpression<unsigned_long> local_48;
  undefined1 local_40 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  Path *this_local;
  
  _kjCondition._32_8_ = __filename;
  local_50 = Array<kj::String>::size((Array<kj::String> *)__filename);
  local_48 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_50);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator>
            ((DebugComparison<unsigned_long,_int> *)local_40,&local_48,
             (int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[26]>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x78,FAILED,"parts.size() > 0","_kjCondition,\"root path has no basename\"",
               (DebugComparison<unsigned_long,_int> *)local_40,
               (char (*) [26])"root path has no basename");
    kj::_::Debug::Fault::fatal(&local_60);
  }
  heapArrayBuilder<kj::String>((ArrayBuilder<kj::String> *)local_90,1);
  sVar2 = Array<kj::String>::size((Array<kj::String> *)__filename);
  pSVar3 = Array<kj::String>::operator[]((Array<kj::String> *)__filename,sVar2 - 1);
  pSVar3 = mv<kj::String>(pSVar3);
  ArrayBuilder<kj::String>::add<kj::String>((ArrayBuilder<kj::String> *)local_90,pSVar3);
  ArrayBuilder<kj::String>::finish(&local_a8,(ArrayBuilder<kj::String> *)local_90);
  Path(this,&local_a8,ALREADY_CHECKED);
  Array<kj::String>::~Array(&local_a8);
  ArrayBuilder<kj::String>::~ArrayBuilder((ArrayBuilder<kj::String> *)local_90);
  return (char *)this;
}

Assistant:

Path Path::basename() && {
  KJ_REQUIRE(parts.size() > 0, "root path has no basename");
  auto newParts = kj::heapArrayBuilder<String>(1);
  newParts.add(kj::mv(parts[parts.size() - 1]));
  return Path(newParts.finish(), ALREADY_CHECKED);
}